

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O3

UnicodeString * __thiscall
icu_63::RuleBasedNumberFormat::getRuleSetDisplayName
          (UnicodeString *__return_storage_ptr__,RuleBasedNumberFormat *this,int32_t index,
          Locale *localeParam)

{
  int iVar1;
  uint uVar2;
  char *src;
  char16_t *pcVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int iVar4;
  ulong uVar5;
  UnicodeString localeName;
  ConstChar16Ptr local_a0;
  ConstChar16Ptr local_98;
  char16_t *local_90;
  char16_t *local_80;
  UnicodeString local_70;
  
  if ((index < 0 || this->localizations == (LocalizationInfo *)0x0) ||
     (iVar1 = (*this->localizations->_vptr_LocalizationInfo[3])(), iVar1 <= index)) {
    (__return_storage_ptr__->super_Replaceable).super_UObject._vptr_UObject =
         (_func_int **)&PTR__UnicodeString_003febe0;
    (__return_storage_ptr__->fUnion).fStackFields.fLengthAndFlags = 2;
    UnicodeString::setToBogus(__return_storage_ptr__);
  }
  else {
    src = Locale::getBaseName(localeParam);
    UnicodeString::UnicodeString(&local_70,src,-1,kInvariant);
    if (-1 < local_70.fUnion.fStackFields.fLengthAndFlags) {
      local_70.fUnion.fFields.fLength = (int)local_70.fUnion.fStackFields.fLengthAndFlags >> 5;
    }
    pcVar3 = UnicodeString::getBuffer(&local_70,local_70.fUnion.fFields.fLength + 1);
joined_r0x0022d73b:
    if (-1 < local_70.fUnion.fFields.fLength) {
      uVar5 = (ulong)(uint)local_70.fUnion.fFields.fLength;
      pcVar3[uVar5] = L'\0';
      uVar2 = (*this->localizations->_vptr_LocalizationInfo[8])(this->localizations,pcVar3);
      if (-1 < (int)uVar2) {
        iVar1 = (*this->localizations->_vptr_LocalizationInfo[7])
                          (this->localizations,(ulong)uVar2,(ulong)(uint)index);
        local_98.p_ = (char16_t *)CONCAT44(extraout_var_00,iVar1);
        UnicodeString::UnicodeString(__return_storage_ptr__,'\x01',&local_98,-1);
        local_80 = local_98.p_;
        goto LAB_0022d82d;
      }
      local_70.fUnion.fFields.fLength = -(uint)(uVar5 == 0);
      do {
        if (uVar5 < 2) goto joined_r0x0022d73b;
        uVar5 = uVar5 - 1;
        iVar1 = (int)uVar5;
      } while (pcVar3[uVar5 & 0xffffffff] != L'_');
      if (iVar1 + 1 < 2) {
LAB_0022d7bb:
        local_70.fUnion.fFields.fLength = (int32_t)uVar5;
      }
      else {
        iVar4 = 1;
        if (iVar1 < 1) {
          iVar4 = iVar1;
        }
        local_70.fUnion.fFields.fLength = iVar4 - 1;
        do {
          iVar1 = (int)uVar5;
          if (pcVar3[(uVar5 & 0xffffffff) - 1] != L'_') goto LAB_0022d7bb;
          uVar5 = (ulong)(iVar1 - 1);
        } while (1 < iVar1);
      }
      goto joined_r0x0022d73b;
    }
    iVar1 = (*this->localizations->_vptr_LocalizationInfo[4])
                      (this->localizations,(ulong)(uint)index);
    local_a0.p_ = (char16_t *)CONCAT44(extraout_var,iVar1);
    UnicodeString::UnicodeString(__return_storage_ptr__,'\x01',&local_a0,-1);
    local_90 = local_a0.p_;
LAB_0022d82d:
    UnicodeString::~UnicodeString(&local_70);
  }
  return __return_storage_ptr__;
}

Assistant:

UnicodeString 
RuleBasedNumberFormat::getRuleSetDisplayName(int32_t index, const Locale& localeParam) {
    if (localizations && index >= 0 && index < localizations->getNumberOfRuleSets()) {
        UnicodeString localeName(localeParam.getBaseName(), -1, UnicodeString::kInvariant); 
        int32_t len = localeName.length();
        UChar* localeStr = localeName.getBuffer(len + 1);
        while (len >= 0) {
            localeStr[len] = 0;
            int32_t ix = localizations->indexForLocale(localeStr);
            if (ix >= 0) {
                UnicodeString name(TRUE, localizations->getDisplayName(ix, index), -1);
                return name;
            }
            
            // trim trailing portion, skipping over ommitted sections
            do { --len;} while (len > 0 && localeStr[len] != 0x005f); // underscore
            while (len > 0 && localeStr[len-1] == 0x005F) --len;
        }
        UnicodeString name(TRUE, localizations->getRuleSetName(index), -1);
        return name;
    }
    UnicodeString bogus;
    bogus.setToBogus();
    return bogus;
}